

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_transaction.cpp
# Opt level: O2

TransactionController * __thiscall
cfd::api::TransactionApi::CreateRawTransaction
          (TransactionController *__return_storage_ptr__,TransactionApi *this,uint32_t version,
          uint32_t locktime,vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *txins,
          vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> *txouts)

{
  CfdException *this_00;
  TransactionController *this_01;
  uint32_t version_local;
  string local_98;
  TransactionController txc;
  
  version_local = version;
  if (version < 5) {
    this_01 = &txc;
    TransactionController::TransactionController(this_01,version,locktime);
    AbstractTransactionController::GetHex_abi_cxx11_
              (&local_98,&this_01->super_AbstractTransactionController);
    AddRawTransaction(__return_storage_ptr__,(TransactionApi *)this_01,&local_98,txins,txouts);
    std::__cxx11::string::~string((string *)&local_98);
    TransactionController::~TransactionController(&txc);
    return __return_storage_ptr__;
  }
  txc.super_AbstractTransactionController._vptr_AbstractTransactionController =
       (_func_int **)0x4f90cd;
  txc.super_AbstractTransactionController.tx_address_._0_4_ = 0x46;
  txc.transaction_.super_AbstractTransaction._vptr_AbstractTransaction =
       (_func_int **)anon_var_dwarf_2176dd;
  core::logger::warn<unsigned_int&>
            ((CfdSourceLocation *)&txc,
             "Failed to CreateRawTransaction. invalid version number: version={}",&version_local);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&txc,"Invalid version number. We supports only 1, 2, 3, or 4:",
             (allocator *)&local_98);
  core::CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)&txc);
  __cxa_throw(this_00,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

TransactionController TransactionApi::CreateRawTransaction(
    uint32_t version, uint32_t locktime, const std::vector<TxIn>& txins,
    const std::vector<TxOut>& txouts) const {
  if (4 < version) {
    warn(
        CFD_LOG_SOURCE,
        "Failed to CreateRawTransaction. invalid version number: version={}",  // NOLINT
        version);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Invalid version number. We supports only 1, 2, 3, or 4:");
  }

  TransactionController txc(version, locktime);
  return AddRawTransaction(txc.GetHex(), txins, txouts);
}